

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O3

void __thiscall
pg::QPTSolver::updateState
          (QPTSolver *this,unsigned_long *_n0,unsigned_long *_n1,int *_max0,int *_max1,int *_k0,
          int *_k1)

{
  Game *pGVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  undefined8 *unaff_R13;
  ulong uVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  undefined1 in_ZMM2 [64];
  undefined1 auVar53 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar25 [32];
  undefined1 auVar22 [16];
  undefined1 auVar28 [32];
  
  pGVar1 = (this->super_Solver).game;
  lVar18 = pGVar1->n_vertices;
  if (lVar18 < 1) {
    iVar37 = -1;
    uVar17 = 0;
    iVar38 = -1;
    uVar15 = 0;
  }
  else {
    auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar30 = vpbroadcastq_avx512f(ZEXT816(0x3f));
    auVar31 = vpbroadcastq_avx512f(ZEXT816(1));
    auVar53._8_4_ = 1;
    auVar53._0_8_ = 0x100000001;
    auVar53._12_4_ = 1;
    auVar53._16_4_ = 1;
    auVar53._20_4_ = 1;
    auVar53._24_4_ = 1;
    auVar53._28_4_ = 1;
    auVar32 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar26 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
    auVar54 = ZEXT1664((undefined1  [16])0x0);
    auVar27 = vpcmpeqd_avx2(in_ZMM12._0_32_,in_ZMM12._0_32_);
    auVar55 = ZEXT1664((undefined1  [16])0x0);
    uVar17 = lVar18 + 7U & 0xfffffffffffffff8;
    auVar33 = vpbroadcastq_avx512f();
    do {
      uVar15 = vpcmpuq_avx512f(auVar29,auVar33,2);
      auVar34 = vmovdqa64_avx512f(auVar55);
      auVar35 = vmovdqa64_avx512f(auVar54);
      vpsrlq_avx512f(auVar29,6);
      uVar17 = uVar17 - 8;
      auVar55 = vpgatherqq_avx512f(((this->super_Solver).disabled)->_bits[(long)unaff_R13]);
      bVar11 = (byte)uVar15;
      auVar54._8_8_ = (ulong)((byte)(uVar15 >> 1) & 1) * auVar55._8_8_;
      auVar54._0_8_ = (ulong)(bVar11 & 1) * auVar55._0_8_;
      auVar54._16_8_ = (ulong)((byte)(uVar15 >> 2) & 1) * auVar55._16_8_;
      auVar54._24_8_ = (ulong)((byte)(uVar15 >> 3) & 1) * auVar55._24_8_;
      auVar54._32_8_ = (ulong)((byte)(uVar15 >> 4) & 1) * auVar55._32_8_;
      auVar54._40_8_ = (ulong)((byte)(uVar15 >> 5) & 1) * auVar55._40_8_;
      auVar54._48_8_ = (ulong)((byte)(uVar15 >> 6) & 1) * auVar55._48_8_;
      auVar54._56_8_ = (uVar15 >> 7) * auVar55._56_8_;
      auVar55 = vpandq_avx512f(auVar29,auVar30);
      auVar55 = vpsllvq_avx512f(auVar31,auVar55);
      auVar55 = vpandq_avx512f(auVar54,auVar55);
      auVar54 = vpsllq_avx512f(auVar29,2);
      auVar29 = vpaddq_avx512f(auVar29,auVar32);
      uVar19 = vptestnmq_avx512f(auVar55,auVar55);
      uVar19 = uVar15 & uVar19;
      auVar55 = vpgatherdq_avx512f(*(undefined4 *)(&pGVar1->_priority + (long)_max1));
      auVar36._8_8_ = (ulong)((byte)(uVar19 >> 1) & 1) * auVar55._8_8_;
      auVar36._0_8_ = (ulong)((byte)uVar19 & 1) * auVar55._0_8_;
      auVar36._16_8_ = (ulong)((byte)(uVar19 >> 2) & 1) * auVar55._16_8_;
      auVar36._24_8_ = (ulong)((byte)(uVar19 >> 3) & 1) * auVar55._24_8_;
      auVar36._32_8_ = (ulong)((byte)(uVar19 >> 4) & 1) * auVar55._32_8_;
      auVar36._40_8_ = (ulong)((byte)(uVar19 >> 5) & 1) * auVar55._40_8_;
      auVar36._48_8_ = (ulong)((byte)(uVar19 >> 6) & 1) * auVar55._48_8_;
      auVar36._56_8_ = (uVar19 >> 7) * auVar55._56_8_;
      vpaddq_avx512f(auVar36,auVar54);
      auVar23 = vpgatherqd_avx512f(*unaff_R13);
      auVar24._4_4_ = (uint)((byte)(uVar19 >> 1) & 1) * auVar23._4_4_;
      auVar24._0_4_ = (uint)((byte)uVar19 & 1) * auVar23._0_4_;
      auVar24._8_4_ = (uint)((byte)(uVar19 >> 2) & 1) * auVar23._8_4_;
      auVar24._12_4_ = (uint)((byte)(uVar19 >> 3) & 1) * auVar23._12_4_;
      auVar24._16_4_ = (uint)((byte)(uVar19 >> 4) & 1) * auVar23._16_4_;
      auVar24._20_4_ = (uint)((byte)(uVar19 >> 5) & 1) * auVar23._20_4_;
      auVar24._24_4_ = (uint)((byte)(uVar19 >> 6) & 1) * auVar23._24_4_;
      auVar24._28_4_ = (uint)(byte)(uVar19 >> 7) * auVar23._28_4_;
      auVar23 = vpand_avx2(auVar24,auVar53);
      uVar20 = vptestmd_avx512vl(auVar23,auVar23);
      uVar20 = uVar19 & uVar20;
      uVar16 = vptestnmd_avx512vl(auVar23,auVar23);
      uVar19 = uVar19 & uVar16;
      auVar23 = vpmaxsd_avx512vl(auVar24,auVar27);
      bVar2 = (bool)((byte)uVar19 & 1);
      iVar37 = auVar27._0_4_;
      bVar4 = (bool)((byte)(uVar19 >> 1) & 1);
      iVar39 = auVar27._4_4_;
      bVar5 = (bool)((byte)(uVar19 >> 2) & 1);
      iVar41 = auVar27._8_4_;
      bVar6 = (bool)((byte)(uVar19 >> 3) & 1);
      iVar43 = auVar27._12_4_;
      bVar7 = (bool)((byte)(uVar19 >> 4) & 1);
      iVar45 = auVar27._16_4_;
      bVar8 = (bool)((byte)(uVar19 >> 5) & 1);
      iVar47 = auVar27._20_4_;
      bVar9 = (bool)((byte)(uVar19 >> 6) & 1);
      iVar49 = auVar27._24_4_;
      bVar10 = SUB81(uVar19 >> 7,0);
      iVar51 = auVar27._28_4_;
      auVar55 = vpmovm2q_avx512dq(uVar20);
      auVar55 = vpsubq_avx512f(auVar34,auVar55);
      auVar54 = vpmovm2q_avx512dq(uVar19);
      auVar24 = vpmaxsd_avx512vl(auVar24,auVar26);
      bVar3 = (bool)((byte)uVar20 & 1);
      iVar38 = auVar26._0_4_;
      auVar25._0_4_ = (uint)bVar3 * auVar24._0_4_ | (uint)!bVar3 * iVar38;
      bVar3 = (bool)((byte)(uVar20 >> 1) & 1);
      iVar40 = auVar26._4_4_;
      auVar25._4_4_ = (uint)bVar3 * auVar24._4_4_ | (uint)!bVar3 * iVar40;
      bVar3 = (bool)((byte)(uVar20 >> 2) & 1);
      iVar42 = auVar26._8_4_;
      auVar25._8_4_ = (uint)bVar3 * auVar24._8_4_ | (uint)!bVar3 * iVar42;
      bVar3 = (bool)((byte)(uVar20 >> 3) & 1);
      iVar44 = auVar26._12_4_;
      auVar25._12_4_ = (uint)bVar3 * auVar24._12_4_ | (uint)!bVar3 * iVar44;
      bVar3 = (bool)((byte)(uVar20 >> 4) & 1);
      iVar46 = auVar26._16_4_;
      auVar25._16_4_ = (uint)bVar3 * auVar24._16_4_ | (uint)!bVar3 * iVar46;
      bVar3 = (bool)((byte)(uVar20 >> 5) & 1);
      iVar48 = auVar26._20_4_;
      auVar25._20_4_ = (uint)bVar3 * auVar24._20_4_ | (uint)!bVar3 * iVar48;
      bVar3 = (bool)((byte)(uVar20 >> 6) & 1);
      iVar50 = auVar26._24_4_;
      auVar25._24_4_ = (uint)bVar3 * auVar24._24_4_ | (uint)!bVar3 * iVar50;
      bVar3 = SUB81(uVar20 >> 7,0);
      iVar52 = auVar26._28_4_;
      auVar25._28_4_ = (uint)bVar3 * auVar24._28_4_ | (uint)!bVar3 * iVar52;
      auVar54 = vpsubq_avx512f(auVar35,auVar54);
      auVar26 = vmovdqa32_avx512vl(auVar27);
      bVar3 = (bool)((byte)uVar20 & 1);
      auVar27._0_4_ =
           (uint)bVar3 * auVar26._0_4_ |
           (uint)!bVar3 * ((uint)bVar2 * auVar23._0_4_ | (uint)!bVar2 * iVar37);
      bVar2 = (bool)((byte)(uVar20 >> 1) & 1);
      auVar27._4_4_ =
           (uint)bVar2 * auVar26._4_4_ |
           (uint)!bVar2 * ((uint)bVar4 * auVar23._4_4_ | (uint)!bVar4 * iVar39);
      bVar2 = (bool)((byte)(uVar20 >> 2) & 1);
      auVar27._8_4_ =
           (uint)bVar2 * auVar26._8_4_ |
           (uint)!bVar2 * ((uint)bVar5 * auVar23._8_4_ | (uint)!bVar5 * iVar41);
      bVar2 = (bool)((byte)(uVar20 >> 3) & 1);
      auVar27._12_4_ =
           (uint)bVar2 * auVar26._12_4_ |
           (uint)!bVar2 * ((uint)bVar6 * auVar23._12_4_ | (uint)!bVar6 * iVar43);
      bVar2 = (bool)((byte)(uVar20 >> 4) & 1);
      auVar27._16_4_ =
           (uint)bVar2 * auVar26._16_4_ |
           (uint)!bVar2 * ((uint)bVar7 * auVar23._16_4_ | (uint)!bVar7 * iVar45);
      bVar2 = (bool)((byte)(uVar20 >> 5) & 1);
      auVar27._20_4_ =
           (uint)bVar2 * auVar26._20_4_ |
           (uint)!bVar2 * ((uint)bVar8 * auVar23._20_4_ | (uint)!bVar8 * iVar47);
      bVar2 = (bool)((byte)(uVar20 >> 6) & 1);
      auVar27._24_4_ =
           (uint)bVar2 * auVar26._24_4_ |
           (uint)!bVar2 * ((uint)bVar9 * auVar23._24_4_ | (uint)!bVar9 * iVar49);
      bVar2 = SUB81(uVar20 >> 7,0);
      auVar27._28_4_ =
           (uint)bVar2 * auVar26._28_4_ |
           (uint)!bVar2 * ((uint)bVar10 * auVar23._28_4_ | (uint)!bVar10 * iVar51);
      auVar26 = auVar25;
    } while (uVar17 != 0);
    auVar26 = vmovdqa32_avx512vl(auVar25);
    auVar21._0_4_ = (uint)(bVar11 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar11 & 1) * iVar38;
    bVar2 = (bool)((byte)(uVar15 >> 1) & 1);
    auVar21._4_4_ = (uint)bVar2 * auVar26._4_4_ | (uint)!bVar2 * iVar40;
    bVar2 = (bool)((byte)(uVar15 >> 2) & 1);
    auVar21._8_4_ = (uint)bVar2 * auVar26._8_4_ | (uint)!bVar2 * iVar42;
    bVar2 = (bool)((byte)(uVar15 >> 3) & 1);
    auVar21._12_4_ = (uint)bVar2 * auVar26._12_4_ | (uint)!bVar2 * iVar44;
    bVar2 = (bool)((byte)(uVar15 >> 4) & 1);
    auVar23._16_4_ = (uint)bVar2 * auVar26._16_4_ | (uint)!bVar2 * iVar46;
    auVar23._0_16_ = auVar21;
    bVar2 = (bool)((byte)(uVar15 >> 5) & 1);
    auVar23._20_4_ = (uint)bVar2 * auVar26._20_4_ | (uint)!bVar2 * iVar48;
    bVar2 = (bool)((byte)(uVar15 >> 6) & 1);
    auVar23._24_4_ = (uint)bVar2 * auVar26._24_4_ | (uint)!bVar2 * iVar50;
    bVar2 = SUB81(uVar15 >> 7,0);
    auVar23._28_4_ = (uint)bVar2 * auVar26._28_4_ | (uint)!bVar2 * iVar52;
    auVar30 = vmovdqa64_avx512f(auVar54);
    auVar29._0_8_ = (ulong)(bVar11 & 1) * auVar30._0_8_ | (ulong)!(bool)(bVar11 & 1) * auVar35._0_8_
    ;
    bVar2 = (bool)((byte)(uVar15 >> 1) & 1);
    auVar29._8_8_ = (ulong)bVar2 * auVar30._8_8_ | (ulong)!bVar2 * auVar35._8_8_;
    bVar2 = (bool)((byte)(uVar15 >> 2) & 1);
    auVar29._16_8_ = (ulong)bVar2 * auVar30._16_8_ | (ulong)!bVar2 * auVar35._16_8_;
    bVar2 = (bool)((byte)(uVar15 >> 3) & 1);
    auVar29._24_8_ = (ulong)bVar2 * auVar30._24_8_ | (ulong)!bVar2 * auVar35._24_8_;
    bVar2 = (bool)((byte)(uVar15 >> 4) & 1);
    auVar29._32_8_ = (ulong)bVar2 * auVar30._32_8_ | (ulong)!bVar2 * auVar35._32_8_;
    bVar2 = (bool)((byte)(uVar15 >> 5) & 1);
    auVar29._40_8_ = (ulong)bVar2 * auVar30._40_8_ | (ulong)!bVar2 * auVar35._40_8_;
    bVar2 = (bool)((byte)(uVar15 >> 6) & 1);
    auVar29._48_8_ = (ulong)bVar2 * auVar30._48_8_ | (ulong)!bVar2 * auVar35._48_8_;
    auVar29._56_8_ = (uVar15 >> 7) * auVar30._56_8_ | (ulong)!SUB81(uVar15 >> 7,0) * auVar35._56_8_;
    auVar26 = vextracti64x4_avx512f(auVar29,1);
    auVar27 = vmovdqa32_avx512vl(auVar27);
    auVar22._0_4_ = (uint)(bVar11 & 1) * auVar27._0_4_ | (uint)!(bool)(bVar11 & 1) * iVar37;
    bVar2 = (bool)((byte)(uVar15 >> 1) & 1);
    auVar22._4_4_ = (uint)bVar2 * auVar27._4_4_ | (uint)!bVar2 * iVar39;
    bVar2 = (bool)((byte)(uVar15 >> 2) & 1);
    auVar22._8_4_ = (uint)bVar2 * auVar27._8_4_ | (uint)!bVar2 * iVar41;
    bVar2 = (bool)((byte)(uVar15 >> 3) & 1);
    auVar22._12_4_ = (uint)bVar2 * auVar27._12_4_ | (uint)!bVar2 * iVar43;
    bVar2 = (bool)((byte)(uVar15 >> 4) & 1);
    auVar28._16_4_ = (uint)bVar2 * auVar27._16_4_ | (uint)!bVar2 * iVar45;
    auVar28._0_16_ = auVar22;
    bVar2 = (bool)((byte)(uVar15 >> 5) & 1);
    auVar28._20_4_ = (uint)bVar2 * auVar27._20_4_ | (uint)!bVar2 * iVar47;
    bVar2 = (bool)((byte)(uVar15 >> 6) & 1);
    auVar28._24_4_ = (uint)bVar2 * auVar27._24_4_ | (uint)!bVar2 * iVar49;
    bVar2 = SUB81(uVar15 >> 7,0);
    auVar28._28_4_ = (uint)bVar2 * auVar27._28_4_ | (uint)!bVar2 * iVar51;
    auVar30 = vmovdqa64_avx512f(auVar55);
    auVar31._0_8_ = (ulong)(bVar11 & 1) * auVar30._0_8_ | (ulong)!(bool)(bVar11 & 1) * auVar34._0_8_
    ;
    bVar2 = (bool)((byte)(uVar15 >> 1) & 1);
    auVar31._8_8_ = (ulong)bVar2 * auVar30._8_8_ | (ulong)!bVar2 * auVar34._8_8_;
    bVar2 = (bool)((byte)(uVar15 >> 2) & 1);
    auVar31._16_8_ = (ulong)bVar2 * auVar30._16_8_ | (ulong)!bVar2 * auVar34._16_8_;
    bVar2 = (bool)((byte)(uVar15 >> 3) & 1);
    auVar31._24_8_ = (ulong)bVar2 * auVar30._24_8_ | (ulong)!bVar2 * auVar34._24_8_;
    bVar2 = (bool)((byte)(uVar15 >> 4) & 1);
    auVar31._32_8_ = (ulong)bVar2 * auVar30._32_8_ | (ulong)!bVar2 * auVar34._32_8_;
    bVar2 = (bool)((byte)(uVar15 >> 5) & 1);
    auVar31._40_8_ = (ulong)bVar2 * auVar30._40_8_ | (ulong)!bVar2 * auVar34._40_8_;
    bVar2 = (bool)((byte)(uVar15 >> 6) & 1);
    auVar31._48_8_ = (ulong)bVar2 * auVar30._48_8_ | (ulong)!bVar2 * auVar34._48_8_;
    auVar31._56_8_ = (uVar15 >> 7) * auVar30._56_8_ | (ulong)!SUB81(uVar15 >> 7,0) * auVar34._56_8_;
    auVar29 = vpaddq_avx512f(auVar29,ZEXT3264(auVar26));
    auVar12 = vpaddq_avx(auVar29._0_16_,auVar29._16_16_);
    auVar13 = vpshufd_avx(auVar12,0xee);
    auVar12 = vpaddq_avx(auVar12,auVar13);
    uVar15 = auVar12._0_8_;
    auVar12 = vpmaxsd_avx(auVar21,auVar23._16_16_);
    auVar13 = vpshufd_avx(auVar12,0xee);
    auVar12 = vpmaxsd_avx(auVar12,auVar13);
    auVar13 = vpshufd_avx(auVar12,0x55);
    auVar12 = vpmaxsd_avx(auVar12,auVar13);
    iVar38 = auVar12._0_4_;
    auVar12 = vpmaxsd_avx(auVar22,auVar28._16_16_);
    auVar13 = vpshufd_avx(auVar12,0xee);
    auVar12 = vpmaxsd_avx(auVar12,auVar13);
    auVar13 = vpshufd_avx(auVar12,0x55);
    auVar12 = vpmaxsd_avx(auVar12,auVar13);
    iVar37 = auVar12._0_4_;
    auVar26 = vextracti64x4_avx512f(auVar31,1);
    auVar29 = vpaddq_avx512f(auVar31,ZEXT3264(auVar26));
    auVar12 = vpaddq_avx(auVar29._0_16_,auVar29._16_16_);
    auVar13 = vpshufd_avx(auVar12,0xee);
    auVar12 = vpaddq_avx(auVar12,auVar13);
    uVar17 = auVar12._0_8_;
  }
  *_n0 = uVar15;
  uVar20 = uVar15 + 1;
  *_n1 = uVar17;
  *_max0 = iVar37;
  *_max1 = iVar38;
  uVar16 = 0x20;
  uVar14 = (uint)((uVar20 & uVar15) != 0);
  lVar18 = 0;
  do {
    uVar15 = 0;
    if ((*(ulong *)((long)&ceil_log2(unsigned_long_long)::t + lVar18) & uVar20) != 0) {
      uVar15 = uVar16;
    }
    uVar14 = uVar14 + (int)uVar15;
    uVar20 = uVar20 >> uVar15;
    uVar16 = uVar16 >> 1;
    lVar18 = lVar18 + 8;
  } while (lVar18 != 0x30);
  uVar15 = uVar17 + 1;
  *_k0 = uVar14 + 1;
  uVar20 = 0x20;
  uVar14 = (uint)((uVar15 & uVar17) != 0);
  lVar18 = 0;
  do {
    uVar17 = 0;
    if ((*(ulong *)((long)&ceil_log2(unsigned_long_long)::t + lVar18) & uVar15) != 0) {
      uVar17 = uVar20;
    }
    uVar14 = uVar14 + (int)uVar17;
    uVar15 = uVar15 >> uVar17;
    uVar20 = uVar20 >> 1;
    lVar18 = lVar18 + 8;
  } while (lVar18 != 0x30);
  *_k1 = uVar14 + 1;
  return;
}

Assistant:

void
QPTSolver::updateState(unsigned long &_n0, unsigned long &_n1, int &_max0, int &_max1, int &_k0, int &_k1)
{
    // determine number of even/odd vertices and highest even/odd priority
    unsigned long n0 = 0;
    unsigned long n1 = 0;
    int max0 = -1;
    int max1 = -1;

    for (int i=0; i<nodecount(); i++) {
        if (disabled[i]) continue;
        const int pr = priority(i);
        if ((pr&1) == 0) {
            if (pr > max0) max0 = pr;
            n0++;
        } else {
            if (pr > max1) max1 = pr;
            n1++;
        }
    }

    _n0 = n0;
    _n1 = n1;
    _max0 = max0;
    _max1 = max1;

    _k0 = 1+ceil_log2(n0+1);
    _k1 = 1+ceil_log2(n1+1);
}